

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_is_cow_supported(filemgr *src,filemgr *dst)

{
  undefined4 uVar1;
  long in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  uVar1 = (**(code **)(*(long *)(in_RDI + 0xe8) + 0x70))(*(undefined4 *)(in_RDI + 0x14));
  *(undefined4 *)(in_RDI + 0x16c) = uVar1;
  if (*(int *)(in_RDI + 0x16c) < 0) {
    local_1 = false;
  }
  else {
    uVar1 = (**(code **)(*(long *)(in_RSI + 0xe8) + 0x70))(*(undefined4 *)(in_RSI + 0x14));
    *(undefined4 *)(in_RSI + 0x16c) = uVar1;
    if (*(int *)(in_RSI + 0x16c) < 0) {
      local_1 = false;
    }
    else if ((*(int *)(in_RDI + 0x16c) == *(int *)(in_RSI + 0x16c)) &&
            (*(int *)(in_RDI + 0x16c) != 1)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool filemgr_is_cow_supported(struct filemgr *src, struct filemgr *dst)
{
    src->fs_type = src->ops->get_fs_type(src->fd);
    if (src->fs_type < 0) {
        return false;
    }
    dst->fs_type = dst->ops->get_fs_type(dst->fd);
    if (dst->fs_type < 0) {
        return false;
    }
    if (src->fs_type == dst->fs_type && src->fs_type != FILEMGR_FS_NO_COW) {
        return true;
    }
    return false;
}